

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::ParallelDelaunay3d::~ParallelDelaunay3d(ParallelDelaunay3d *this)

{
  ParallelDelaunay3d *this_local;
  
  (this->super_Delaunay).super_Counted._vptr_Counted =
       (_func_int **)&PTR__ParallelDelaunay3d_002baa78;
  vector<unsigned_int>::~vector(&this->levels_);
  vector<unsigned_int>::~vector(&this->reorder_);
  vector<double>::~vector(&this->heights_);
  std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
  ~vector(&this->threads_);
  vector<unsigned_char>::~vector(&this->cell_thread_);
  vector<unsigned_int>::~vector(&this->cell_next_);
  vector<int>::~vector(&this->cell_to_cell_store_);
  vector<int>::~vector(&this->cell_to_v_store_);
  Delaunay::~Delaunay(&this->super_Delaunay);
  return;
}

Assistant:

class GEOGRAM_API ParallelDelaunay3d : public Delaunay {
    public:
        ParallelDelaunay3d(coord_index_t dimension = 3);

        void set_vertices(
            index_t nb_vertices, const double* vertices
        ) override;

        index_t nearest_vertex(const double* p) const override;

        void set_BRIO_levels(const vector<index_t>& levels) override;

    private:
        vector<signed_index_t> cell_to_v_store_;
        vector<signed_index_t> cell_to_cell_store_;
        vector<index_t> cell_next_;
        vector<thread_index_t> cell_thread_;
        ThreadGroup threads_;
        bool weighted_; // true for regular triangulation.
        vector<double> heights_; // only used in weighted mode.        
        vector<index_t> reorder_;
        vector<index_t> levels_;

         bool debug_mode_;

         bool verbose_debug_mode_;

        bool benchmark_mode_;
        
        
        friend class Delaunay3dThread;
    }